

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O1

bool __thiscall
Hospital::Validate_Patient_To_Enter
          (Hospital *this,string *username,string *password,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  string *psVar4;
  pointer pPVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  string username_1;
  string local_78;
  string *local_58;
  string local_50;
  
  pPVar5 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = password;
  if ((All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar5) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      Human::User_name_Getter_abi_cxx11_
                (&local_78,(Human *)((long)&(pPVar5->super_Human).Id._M_dataplus._M_p + lVar7));
      if (local_78._M_string_length == username->_M_string_length) {
        if (local_78._M_string_length == 0) {
          bVar8 = true;
        }
        else {
          iVar2 = bcmp(local_78._M_dataplus._M_p,(username->_M_dataplus)._M_p,
                       local_78._M_string_length);
          bVar8 = iVar2 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      if ((bVar8) &&
         (Human::Password_Getter_abi_cxx11_
                    (&local_50,
                     (Human *)((long)&(((All_Of_Patients->
                                        super__Vector_base<Patient,_std::allocator<Patient>_>).
                                        _M_impl.super__Vector_impl_data._M_start)->super_Human).Id.
                                      _M_dataplus + lVar7)),
         local_50._M_string_length == local_58->_M_string_length)) {
        if (local_50._M_string_length == 0) {
          bVar9 = true;
        }
        else {
          iVar2 = bcmp(local_50._M_dataplus._M_p,(local_58->_M_dataplus)._M_p,
                       local_50._M_string_length);
          bVar9 = iVar2 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((bVar8) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (bVar9) {
        psVar4 = (string *)__cxa_allocate_exception(0x20);
        *(string **)psVar4 = psVar4 + 0x10;
        pcVar1 = (username->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>(psVar4,pcVar1,pcVar1 + username->_M_string_length)
        ;
        __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      uVar6 = uVar6 + 1;
      pPVar5 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pPVar5 >> 4) *
              -0x30c30c30c30c30c3;
      lVar7 = lVar7 + 0x150;
    } while (uVar6 <= uVar3 && uVar3 - uVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"your username or password is incorrect .",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return false;
}

Assistant:

bool Hospital :: Validate_Patient_To_Enter (string username , string password , vector<Patient>All_Of_Patients) {
    int cntr = 0;

    for (int i = 0; i < All_Of_Patients.size(); ++i) {
        if (All_Of_Patients[i].User_name_Getter() == username && All_Of_Patients[i].Password_Getter() == password) {
            cntr++;
            break;
        }
    }

    try {
        if (cntr == 0) {
            cout << "your username or password is incorrect ." << endl;
            return false;
        } else throw username;
    }
    catch (string username) {
        cout << "you entered successfully ." << endl;
        return true;
    }
}